

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# myserver.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *msgdir;
  string usrdir;
  undefined8 __buf;
  bool bVar1;
  int iVar2;
  int __fd;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  ssize_t sVar6;
  SendMessage *this;
  ostream *poVar7;
  undefined4 uStack_528;
  int local_524;
  char FAILURE [5];
  undefined4 local_510;
  socklen_t addrlen;
  char EXECUTEPENDING [4];
  char SUCCESS [4];
  char USERDIR [6];
  string commandResult;
  char message [12];
  undefined4 uStack_4cc;
  char message_2 [12];
  undefined4 uStack_4ac;
  sockaddr_in cliaddress;
  string local_488 [32];
  sockaddr local_468;
  string local_458 [32];
  char buffer [1024];
  
  builtin_strncpy(USERDIR,"users",6);
  builtin_strncpy(SUCCESS,"OK\n",4);
  stack0xfffffffffffffae4 = stack0xfffffffffffffae4 & 0xffffff00;
  builtin_strncpy(FAILURE,"ERR\n",4);
  builtin_strncpy(EXECUTEPENDING,"EP\n",4);
  if (argc == 3) {
    iVar2 = atoi(argv[1]);
    msgdir = argv[2];
    std::__cxx11::string::string(local_458,USERDIR,(allocator *)buffer);
    usrdir._M_dataplus._M_p._4_4_ = local_524;
    usrdir._M_dataplus._M_p._0_4_ = uStack_528;
    usrdir._M_string_length._0_1_ = FAILURE[0];
    usrdir._M_string_length._1_1_ = FAILURE[1];
    usrdir._M_string_length._2_1_ = FAILURE[2];
    usrdir._M_string_length._3_1_ = FAILURE[3];
    usrdir._M_string_length._4_4_ = stack0xfffffffffffffae4;
    usrdir.field_2._M_allocated_capacity = (size_type)msgdir;
    usrdir.field_2._8_4_ = local_510;
    usrdir.field_2._12_4_ = addrlen;
    createWorkingDirectories(msgdir,usrdir);
    std::__cxx11::string::~string(local_458);
    local_524 = 1;
    __fd = socket(2,1,0);
    local_468.sa_data[6] = '\0';
    local_468.sa_data[7] = '\0';
    local_468.sa_data[8] = '\0';
    local_468.sa_data[9] = '\0';
    local_468.sa_data[10] = '\0';
    local_468.sa_data[0xb] = '\0';
    local_468.sa_data[0xc] = '\0';
    local_468.sa_data[0xd] = '\0';
    local_468.sa_family = 2;
    local_468.sa_data[2] = '\0';
    local_468.sa_data[3] = '\0';
    local_468.sa_data[4] = '\0';
    local_468.sa_data[5] = '\0';
    local_468.sa_data._0_2_ = (ushort)iVar2 << 8 | (ushort)iVar2 >> 8;
    iVar2 = bind(__fd,&local_468,0x10);
    if (iVar2 == 0) {
      listen(__fd,5);
      addrlen = 0x10;
      local_524 = 0;
      do {
        puts("Waiting for connections...");
        iVar2 = accept(__fd,(sockaddr *)&cliaddress,&addrlen);
        if (0 < iVar2) {
          pcVar4 = inet_ntoa((in_addr)cliaddress.sin_addr.s_addr);
          printf("Client connected from %s:%d...\n",pcVar4,
                 (ulong)(ushort)(cliaddress.sin_port << 8 | cliaddress.sin_port >> 8));
          builtin_strncpy(buffer,"Welcome to myserver, Please enter your command:\n",0x31);
          sVar5 = strlen(buffer);
          send(iVar2,buffer,sVar5,0);
        }
        std::__cxx11::string::string((string *)&commandResult,"",(allocator *)message);
        do {
          sVar6 = recv(iVar2,buffer,0x3ff,0);
          if (sVar6 < 1) {
            if (sVar6 != 0) {
              perror("recv error");
LAB_00103b6a:
              bVar1 = false;
              local_524 = 1;
              goto LAB_00103ac0;
            }
            puts("Client closed remote socket");
            break;
          }
          buffer[sVar6] = '\0';
          printf("Message received: %s",buffer);
          iVar3 = strncasecmp(buffer,"send",4);
          if (iVar3 == 0) {
            this = (SendMessage *)operator_new(0xd0);
            SendMessage::SendMessage(this,msgdir);
LAB_00103870:
            do {
              ServerOperation::getStatus_abi_cxx11_((string *)message,&this->super_ServerOperation);
              send(iVar2,(void *)message._0_8_,CONCAT44(uStack_4cc,message._8_4_),0);
              sVar6 = recv(iVar2,buffer,0x3ff,0);
              if (sVar6 < 1) {
                if (sVar6 != 0) {
                  perror("recv error");
                  std::__cxx11::string::~string((string *)message);
                  goto LAB_00103b6a;
                }
                puts("Client closed remote socket");
                std::__cxx11::string::~string((string *)message);
                break;
              }
              buffer[sVar6] = '\0';
              printf("Message received: %s\n",buffer);
              std::__cxx11::string::~string((string *)message);
              std::__cxx11::string::string(local_488,buffer,(allocator *)message);
              iVar3 = (**(this->super_ServerOperation)._vptr_ServerOperation)(this,local_488);
              std::__cxx11::string::~string(local_488);
            } while ((char)iVar3 != '\0');
            ServerOperation::getStatus_abi_cxx11_((string *)message,&this->super_ServerOperation);
            bVar1 = std::operator==((string *)message,EXECUTEPENDING);
            std::__cxx11::string::~string((string *)message);
            if (bVar1) {
              (*(this->super_ServerOperation)._vptr_ServerOperation[1])((string *)message,this);
              std::__cxx11::string::operator=((string *)&commandResult,(string *)message);
              std::__cxx11::string::~string((string *)message);
              ServerOperation::getStatus_abi_cxx11_((string *)message,&this->super_ServerOperation);
              __buf = message._0_8_;
              ServerOperation::getStatus_abi_cxx11_
                        ((string *)message_2,&this->super_ServerOperation);
              send(iVar2,(void *)__buf,CONCAT44(uStack_4ac,message_2._8_4_),0);
              std::__cxx11::string::~string((string *)message_2);
              std::__cxx11::string::~string((string *)message);
            }
            else {
              ServerOperation::getStatus_abi_cxx11_
                        ((string *)message_2,&this->super_ServerOperation);
              std::operator+((string *)message,(string *)message_2,"\n");
              std::__cxx11::string::operator=((string *)&commandResult,(string *)message);
              std::__cxx11::string::~string((string *)message);
              std::__cxx11::string::~string((string *)message_2);
              send(iVar2,FAILURE,4,0);
            }
            builtin_strncpy(message_2,"placeholder",0xc);
            sVar5 = strlen(message_2);
            recv(iVar2,message_2,sVar5,0);
            send(iVar2,commandResult._M_dataplus._M_p,commandResult._M_string_length,0);
            ServerOperation::getStatus_abi_cxx11_((string *)message,&this->super_ServerOperation);
            poVar7 = std::operator<<((ostream *)&std::cout,(string *)message);
            std::operator<<(poVar7,"\n");
            std::__cxx11::string::~string((string *)message);
            std::operator<<((ostream *)&std::cout,(string *)&commandResult);
          }
          else {
            iVar3 = strncasecmp(buffer,"list",4);
            if (iVar3 == 0) {
              this = (SendMessage *)operator_new(0x68);
              ListMessage::ListMessage((ListMessage *)this,msgdir);
              goto LAB_00103870;
            }
            iVar3 = strncasecmp(buffer,"read",4);
            if (iVar3 == 0) {
              this = (SendMessage *)operator_new(0x70);
              ReadMessage::ReadMessage((ReadMessage *)this,msgdir);
              goto LAB_00103870;
            }
            iVar3 = strncasecmp(buffer,"del",3);
            if (iVar3 == 0) {
              this = (SendMessage *)operator_new(0x70);
              DeleteMessage::DeleteMessage((DeleteMessage *)this,msgdir);
              goto LAB_00103870;
            }
            iVar3 = strncasecmp(buffer,"quit",4);
            if (iVar3 == 0) {
              builtin_strncpy(message,"placeholder",0xc);
              send(iVar2,SUCCESS,3,0);
              sVar5 = strlen(message);
              recv(iVar2,(string *)message,sVar5 - 1,0);
              std::__cxx11::string::assign((char *)&commandResult);
              send(iVar2,commandResult._M_dataplus._M_p,commandResult._M_string_length,0);
              break;
            }
            builtin_strncpy(message,"placeholder",0xc);
            send(iVar2,FAILURE,4,0);
            sVar5 = strlen(message);
            recv(iVar2,(string *)message,sVar5 - 1,0);
            std::__cxx11::string::assign((char *)&commandResult);
            send(iVar2,commandResult._M_dataplus._M_p,commandResult._M_string_length,0);
          }
        } while (buffer._0_4_ != 0x74697571);
        bVar1 = true;
        close(iVar2);
LAB_00103ac0:
        std::__cxx11::string::~string((string *)&commandResult);
      } while (bVar1);
    }
    else {
      perror("bind error");
    }
  }
  else {
    local_524 = 1;
    std::operator<<((ostream *)&std::cout,
                    "No Port or Path to Mailpool directory specified.\nUsage: myserver <port number> <path>\n"
                   );
  }
  return local_524;
}

Assistant:

int main(int argc, char **argv) {
    //ToDo: Put this in Config file
    const char *MESSAGEDIR;
    const char USERDIR[6] = "users";
    const char SUCCESS[4] = "OK\n";
    const char FAILURE[5] = "ERR\n";
    const char EXECUTEPENDING[4] = "EP\n";
    int PORT;

    ServerOperation *command; //command the server executes

    //parse arguments
    if (argc == 3) {
        PORT = atoi(argv[1]);
        MESSAGEDIR = argv[2];
    } else {
        cout << "No Port or Path to Mailpool directory specified.\nUsage: myserver <port number> <path>\n";
        return EXIT_FAILURE;
    }

    //create needed directories
    createWorkingDirectories(MESSAGEDIR, USERDIR);

    //create socket
    int create_socket, new_socket;
    socklen_t addrlen;
    char buffer[BUF];
    long size;
    struct sockaddr_in address, cliaddress;

    create_socket = socket(AF_INET, SOCK_STREAM, 0);

    memset(&address, 0, sizeof(address));
    address.sin_family = AF_INET;
    address.sin_addr.s_addr = INADDR_ANY;
    address.sin_port = htons(PORT);

    if (bind(create_socket, (struct sockaddr *) &address, sizeof(address)) != 0) {
        perror("bind error");
        return EXIT_FAILURE;
    }
    listen(create_socket, 5);

    addrlen = sizeof(struct sockaddr_in);

    //start server loop:
    while (true) {
        printf("Waiting for connections...\n");
        new_socket = accept(create_socket, (struct sockaddr *) &cliaddress, &addrlen);
        if (new_socket > 0) {
            printf("Client connected from %s:%d...\n", inet_ntoa(cliaddress.sin_addr), ntohs(cliaddress.sin_port));
            strcpy(buffer, "Welcome to myserver, Please enter your command:\n");
            send(new_socket, buffer, strlen(buffer), 0);
        }
        //Client connected, start command execution loop:
        bool commandMatched = false;
        string commandResult = "";
        do {
            //get command
            size = recv(new_socket, buffer, BUF - 1, 0);
            if (size > 0) {
                buffer[size] = '\0';
                printf("Message received: %s", buffer);

                commandMatched = true; //we expect a real command, so reset it to true every command call

                //create the received command depending on string that was sent
                if (strncasecmp(buffer, "send", 4) == 0) {
                    command = new SendMessage(MESSAGEDIR);
                } else if (strncasecmp(buffer, "list", 4) == 0) {
                    command = new ListMessage(MESSAGEDIR);
                } else if (strncasecmp(buffer, "read", 4) == 0) {
                    command = new ReadMessage(MESSAGEDIR);
                } else if (strncasecmp(buffer, "del", 3) == 0) {
                    command = new DeleteMessage(MESSAGEDIR);
                } else if (strncasecmp(buffer, "quit", 4) == 0) {
                    //quit
                    //ToDo: make quit a real command :D
                    char message[] = "placeholder";
                    send(new_socket, SUCCESS, strlen(SUCCESS), 0);
                    recv(new_socket, message, strlen(message) - 1, 0); //always wait for confirmation
                    commandResult = "quit\n";
                    send(new_socket, commandResult.c_str(), commandResult.length(), 0);
                    break; //quit command loop -> new client can connect now
                } else {
                    //No commands matched
                    char message[] = "placeholder";
                    send(new_socket, FAILURE, strlen(FAILURE), 0);
                    recv(new_socket, message, strlen(message) - 1, 0); //always wait for confirmation
                    commandMatched = false;
                    commandResult = "No matching command found.\n";
                    send(new_socket, commandResult.c_str(), commandResult.length(), 0);
                }

                //if command was matched - get all the parameters and execute
                if (commandMatched) {
                    //get the parameters
                    do {
                        //always send the client confirmation and the instructions what to do
                        string confirmation = command->getStatus();
                        send(new_socket, confirmation.c_str(), confirmation.length(), 0);

                        //receive next line
                        size = recv(new_socket, buffer, BUF - 1, 0);
                        if (size > 0) {
                            buffer[size] = '\0';
                            printf("Message received: %s\n", buffer);
                        } else if (size == 0) {
                            printf("Client closed remote socket\n");
                            break;
                        } else {
                            perror("recv error");
                            return EXIT_FAILURE;
                        }


                    } while (command->fillMe(buffer)); //Fill Command with parameters till its satisfied

                    //were parameters filled correctly? if yes execute, if not return error message
                    if (command->getStatus() == EXECUTEPENDING) {
                        commandResult = command->execute(); //finally execute command

                        //send the status to the client:
                        send(new_socket, command->getStatus().c_str(), command->getStatus().length(),
                             0); //send command status
                    } else {
                        commandResult = command->getStatus() + "\n"; //save the status as command result

                        //send Error to the client:
                        send(new_socket, FAILURE, strlen(FAILURE), 0); //send command status
                    }
                    char message[] = "placeholder";
                    recv(new_socket, message, strlen(message), 0); //always wait for confirmation
                    send(new_socket, commandResult.c_str(), commandResult.length(), 0); //send command result

                    cout << command->getStatus() << "\n"; //ToDo: remove this line later
                    cout << commandResult; //ToDo: remove this line later
                }

            } else if (size == 0) {
                printf("Client closed remote socket\n");
                break;
            } else {
                perror("recv error");
                return EXIT_FAILURE;
            }
        } while (strncmp(buffer, "quit", 4) != 0);
        close(new_socket);
    }
    close(create_socket);
    return EXIT_SUCCESS;
}